

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQArray *this;
  SQUnsignedInteger SVar3;
  SQObjectValue SVar4;
  uint uVar5;
  SQDelegable *pSVar6;
  SQObjectPtr *pSVar7;
  SQRESULT SVar8;
  SQObjectPtr *pSVar9;
  SQUnsignedInteger nidx;
  SQInteger SVar10;
  SQObjectPtr res;
  SQObjectPtr other;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  pSVar7 = SQVM::GetAt(v,v->_stackbase);
  this = (pSVar7->super_SQObject)._unVal.pArray;
  SVar3 = (this->_values)._size;
  if (SVar3 == 0) {
    SVar10 = 0;
  }
  else {
    local_60.super_SQObject._type = OT_NULL;
    local_60.super_SQObject._unVal.pTable = (SQTable *)0x0;
    SQArray::Get(this,0,&local_60);
    if (1 < (long)SVar3) {
      local_50.super_SQObject._type = OT_NULL;
      local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
      nidx = 1;
      do {
        SQArray::Get(this,nidx,&local_50);
        local_40.super_SQObject._type = (pSVar7->super_SQObject)._type;
        local_40.super_SQObject._unVal = (SQObjectValue)(pSVar7->super_SQObject)._unVal.pTable;
        if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQVM::Push(v,&local_40);
        SQObjectPtr::~SQObjectPtr(&local_40);
        SQVM::Push(v,&local_60);
        SQVM::Push(v,&local_50);
        SVar8 = sq_call(v,3,1,0);
        if (SVar8 < 0) {
          SQObjectPtr::~SQObjectPtr(&local_50);
          SVar10 = -1;
          goto LAB_001161b0;
        }
        pSVar9 = SQVM::GetUp(v,-1);
        SVar4 = (SQObjectValue)(pSVar9->super_SQObject)._unVal.pTable;
        SVar2 = (pSVar9->super_SQObject)._type;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        uVar5 = local_60.super_SQObject._type >> 0x1b;
        local_60.super_SQObject._type = SVar2;
        if ((uVar5 & 1) != 0) {
          pSVar1 = &((local_60.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            pSVar6 = &(local_60.super_SQObject._unVal.pTable)->super_SQDelegable;
            local_60.super_SQObject._unVal = SVar4;
            (*(pSVar6->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
            SVar4 = local_60.super_SQObject._unVal;
          }
        }
        local_60.super_SQObject._unVal = SVar4;
        SQVM::Pop(v);
        nidx = nidx + 1;
      } while (SVar3 != nidx);
      SQObjectPtr::~SQObjectPtr(&local_50);
    }
    SVar10 = 1;
    SQVM::Push(v,&local_60);
LAB_001161b0:
    SQObjectPtr::~SQObjectPtr(&local_60);
  }
  return SVar10;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    if(size == 0) {
        return 0;
    }
    SQObjectPtr res;
    a->Get(0,res);
    if(size > 1) {
        SQObjectPtr other;
        for(SQInteger n = 1; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
    }
    v->Push(res);
    return 1;
}